

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ExprNodeTest_NOT(Fts5Expr *pExpr,Fts5ExprNode *pNode)

{
  uint uVar1;
  long in_RSI;
  Fts5Expr *in_RDI;
  int cmp;
  Fts5ExprNode *p2;
  Fts5ExprNode *p1;
  int rc;
  Fts5ExprNode *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  Fts5Expr *pExpr_00;
  Fts5ExprNode *pNode_00;
  int local_14;
  
  local_14 = 0;
  pNode_00 = *(Fts5ExprNode **)(in_RSI + 0x30);
  pExpr_00 = *(Fts5Expr **)(in_RSI + 0x38);
  while( true ) {
    uVar1 = in_stack_ffffffffffffffd0 & 0xffffff;
    if (local_14 == 0) {
      uVar1 = CONCAT13(pNode_00->bEof == 0,(int3)in_stack_ffffffffffffffd0);
    }
    in_stack_ffffffffffffffd0 = uVar1;
    if ((char)(in_stack_ffffffffffffffd0 >> 0x18) == '\0') break;
    in_stack_ffffffffffffffd4 =
         fts5NodeCompare(pExpr_00,(Fts5ExprNode *)
                                  CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffc8);
    if (0 < in_stack_ffffffffffffffd4) {
      local_14 = (*(code *)pExpr_00->pRoot)(in_RDI,pExpr_00,1,pNode_00->iRowid);
      in_stack_ffffffffffffffd4 =
           fts5NodeCompare(pExpr_00,(Fts5ExprNode *)
                                    CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                           in_stack_ffffffffffffffc8);
    }
    if ((in_stack_ffffffffffffffd4 != 0) || (*(int *)&pExpr_00->pConfig != 0)) break;
    local_14 = (*pNode_00->xNext)(in_RDI,pNode_00,0,0);
  }
  *(int *)(in_RSI + 4) = pNode_00->bEof;
  *(int *)(in_RSI + 8) = pNode_00->bNomatch;
  *(i64 *)(in_RSI + 0x18) = pNode_00->iRowid;
  if (pNode_00->bEof != 0) {
    fts5ExprNodeZeroPoslist(pNode_00);
  }
  return local_14;
}

Assistant:

static int fts5ExprNodeTest_NOT(
  Fts5Expr *pExpr,                /* Expression pPhrase belongs to */
  Fts5ExprNode *pNode             /* FTS5_NOT node to advance */
){
  int rc = SQLITE_OK;
  Fts5ExprNode *p1 = pNode->apChild[0];
  Fts5ExprNode *p2 = pNode->apChild[1];
  assert( pNode->nChild==2 );

  while( rc==SQLITE_OK && p1->bEof==0 ){
    int cmp = fts5NodeCompare(pExpr, p1, p2);
    if( cmp>0 ){
      rc = fts5ExprNodeNext(pExpr, p2, 1, p1->iRowid);
      cmp = fts5NodeCompare(pExpr, p1, p2);
    }
    assert( rc!=SQLITE_OK || cmp<=0 );
    if( cmp || p2->bNomatch ) break;
    rc = fts5ExprNodeNext(pExpr, p1, 0, 0);
  }
  pNode->bEof = p1->bEof;
  pNode->bNomatch = p1->bNomatch;
  pNode->iRowid = p1->iRowid;
  if( p1->bEof ){
    fts5ExprNodeZeroPoslist(p2);
  }
  return rc;
}